

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusConstrainedPOMDPPlanner.cpp
# Opt level: O0

QFunctionsDiscrete * __thiscall
PerseusConstrainedPOMDPPlanner::BackupStage
          (PerseusConstrainedPOMDPPlanner *this,BeliefSet *S,QFunctionsDiscrete *Q)

{
  bool bVar1;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  const_reference ppJVar6;
  long *plVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  reference pvVar9;
  reference pvVar10;
  bool bVar2;
  reference pvVar11;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RCX;
  GaoVectorSet *in_RDX;
  long in_RSI;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *in_RDI;
  double dVar12;
  reference rVar13;
  reference rVar14;
  reference rVar15;
  size_t b;
  double x;
  size_t s;
  size_t a_1;
  int nrImprovedByGab;
  VectorSet Gab;
  GaoVectorSet Gao;
  stringstream estream;
  Index a;
  AlphaVector alpha;
  ValueFunctionPOMDPDiscrete V1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numberOfImprovements;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  logicTable;
  vector<bool,_std::allocator<bool>_> stillNeedToBeImproved;
  size_t k;
  size_t nrS;
  size_t nrA;
  size_t nrNotImproved;
  size_t nrB;
  vector<double,_std::allocator<double>_> VBalpha;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  VB;
  QFunctionsDiscrete *Q1;
  AlphaVectorPlanning *in_stack_fffffffffffff8f8;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffff900;
  AlphaVector *in_stack_fffffffffffff908;
  AlphaVector *in_stack_fffffffffffff910;
  ostream *in_stack_fffffffffffff918;
  AlphaVector *in_stack_fffffffffffff920;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffff928;
  multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  *in_stack_fffffffffffff930;
  QFunctionsDiscrete *in_stack_fffffffffffff938;
  int in_stack_fffffffffffff944;
  _Bit_type in_stack_fffffffffffff948;
  _Bit_type *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  _Bit_type in_stack_fffffffffffff960;
  _Bit_type *in_stack_fffffffffffff968;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffff970;
  Perseus *in_stack_fffffffffffff978;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  GaoVectorSet *in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  ValueFunctionPOMDPDiscrete *in_stack_fffffffffffffad0;
  GaoVectorSet *in_stack_fffffffffffffad8;
  JointBeliefInterface *in_stack_fffffffffffffae0;
  AlphaVectorConstrainedPOMDP *in_stack_fffffffffffffae8;
  reference local_4d8;
  reference local_4c8;
  reference local_4b8;
  reference local_4a8 [3];
  reference local_470;
  ulong local_460;
  double local_430;
  ulong local_428;
  ulong local_420;
  int local_3c4;
  undefined1 local_2f9;
  stringstream local_2d8 [16];
  ostream local_2c8 [380];
  uint local_14c;
  AlphaVector local_130;
  byte local_ee;
  undefined4 local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_d0;
  undefined1 local_b1;
  size_type local_88;
  size_t local_80;
  size_t local_68;
  size_type local_60;
  size_type local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_38;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  *local_20;
  GaoVectorSet *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x927527);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x927534);
  local_60 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                       ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                        local_18);
  local_58 = local_60;
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffff8f8);
  local_68 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x927587);
  AlphaVectorPlanning::GetPU(in_stack_fffffffffffff8f8);
  local_80 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_fffffffffffff900);
  local_b1 = 1;
  std::allocator<bool>::allocator((allocator<bool> *)0x927616);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920,
             (size_type)in_stack_fffffffffffff918,(bool *)in_stack_fffffffffffff910,
             (allocator_type *)in_stack_fffffffffffff908);
  std::allocator<bool>::~allocator((allocator<bool> *)0x92764a);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x927657);
  local_ec = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x927687);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff920,
             (size_type)in_stack_fffffffffffff918,&in_stack_fffffffffffff910->_m_action,
             (allocator_type *)in_stack_fffffffffffff908);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9276bb);
  local_ee = 0;
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::size(local_20);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x9276ed);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)in_stack_fffffffffffff920,(size_type)in_stack_fffffffffffff918,
           (allocator_type *)in_stack_fffffffffffff910);
  std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::~allocator
            ((allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)0x927719);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x927726);
  AlphaVector::AlphaVector(in_stack_fffffffffffff920,(size_t)in_stack_fffffffffffff918);
  AlphaVectorPlanning::QFunctionsToValueFunction(in_stack_fffffffffffff938);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator=
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff910,
             (vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff908);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
            ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff910);
  local_14c = 0;
  while( true ) {
    if (local_68 <= local_14c) {
      Perseus::BackupStageLeadIn(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)in_stack_fffffffffffff920);
      rVar14._M_mask = in_stack_fffffffffffff960;
      rVar14._M_p = in_stack_fffffffffffff968;
      rVar15._M_mask = in_stack_fffffffffffff948;
      rVar15._M_p = in_stack_fffffffffffff950;
      while (local_60 != 0) {
        local_3c4 = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff9b8);
        iVar3 = Perseus::SampleNotImprovedBeliefIndex
                          ((Perseus *)rVar15._M_p,
                           (vector<bool,_std::allocator<bool>_> *)rVar15._M_mask,
                           in_stack_fffffffffffff944);
        local_88 = (size_type)iVar3;
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x927b3a);
        std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::operator[]
                  ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                   local_18,local_88);
        AlphaVectorConstrainedPOMDP::BeliefBackupQ
                  (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                   in_stack_fffffffffffffad0);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::operator=((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)in_stack_fffffffffffff910,
                    (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)in_stack_fffffffffffff908);
        boost::numeric::ublas::
        matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)in_stack_fffffffffffff900);
        for (local_420 = 0; local_420 < local_68; local_420 = local_420 + 1) {
          AlphaVector::SetAction(&local_130,(Index)local_420);
          for (local_428 = 0; local_428 < local_80; local_428 = local_428 + 1) {
            boost::numeric::ublas::
            matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffff900,(size_type)in_stack_fffffffffffff8f8,0x927c14)
            ;
            AlphaVector::SetValue
                      (in_stack_fffffffffffff910,(double)in_stack_fffffffffffff908,
                       (Index)((ulong)in_stack_fffffffffffff900 >> 0x20));
          }
          ppJVar6 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                    operator[]((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                                *)local_18,local_88);
          plVar7 = (long *)((long)&(*ppJVar6)->field_0x0 + *(long *)((long)**ppJVar6 + -0xb8));
          pvVar8 = AlphaVector::GetValues(&local_130);
          dVar12 = (double)(**(code **)(*plVar7 + 0x80))(plVar7,pvVar8);
          local_430 = dVar12;
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_38,local_420);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,local_88);
          if (dVar12 < *pvVar10) {
            std::
            vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            ::operator[](local_20,local_420);
            BeliefValue::GetMaximizingVector
                      ((BeliefSet *)rVar14._M_p,rVar14._M_mask._4_4_,
                       (ValueFunctionPOMDPDiscrete *)
                       CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
            AlphaVector::operator=
                      (in_stack_fffffffffffff908,(AlphaVector *)in_stack_fffffffffffff900);
            AlphaVector::~AlphaVector((AlphaVector *)0x927e19);
          }
          std::
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          ::operator[](in_RDI,local_420);
          bVar1 = AlphaVectorPlanning::VectorIsInValueFunction
                            ((AlphaVector *)in_stack_fffffffffffff928,
                             (ValueFunctionPOMDPDiscrete *)in_stack_fffffffffffff920);
          if (!bVar1) {
            std::
            vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            ::operator[](in_RDI,local_420);
            std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                      ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                       in_stack_fffffffffffff910,in_stack_fffffffffffff908);
          }
          for (local_460 = 0; local_460 < local_58; local_460 = local_460 + 1) {
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920,
                                (size_type)in_stack_fffffffffffff918);
            local_470 = rVar13;
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_470);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              in_stack_fffffffffffff9b8 = local_18;
              in_stack_fffffffffffff9c4 = (undefined4)local_460;
              std::
              vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ::operator[](in_RDI,local_420);
              BeliefValue::GetMaximizingVector
                        ((BeliefSet *)rVar14._M_p,rVar14._M_mask._4_4_,
                         (ValueFunctionPOMDPDiscrete *)
                         CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
              AlphaVector::operator=
                        (in_stack_fffffffffffff908,(AlphaVector *)in_stack_fffffffffffff900);
              AlphaVector::~AlphaVector((AlphaVector *)0x927fa0);
              ppJVar6 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                        ::operator[]((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                                      *)local_18,local_460);
              plVar7 = (long *)((long)&(*ppJVar6)->field_0x0 + *(long *)((long)**ppJVar6 + -0xb8));
              pvVar8 = AlphaVector::GetValues(&local_130);
              local_430 = (double)(**(code **)(*plVar7 + 0x80))(plVar7,pvVar8);
              std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[](&local_d0,local_420);
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920,
                                  (size_type)in_stack_fffffffffffff918);
              local_4a8[0] = rVar14;
              bVar2 = std::_Bit_reference::operator_cast_to_bool(local_4a8);
              bVar1 = false;
              if (bVar2) {
                dVar12 = local_430;
                pvVar9 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::operator[](&local_38,local_420);
                pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,local_460)
                ;
                bVar1 = *pvVar10 - 1e-12 <= dVar12;
              }
              if (bVar1) {
                std::
                vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ::operator[](&local_d0,local_420);
                rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920
                                    ,(size_type)in_stack_fffffffffffff918);
                local_4b8 = rVar14;
                std::_Bit_reference::operator=(&local_4b8,false);
                pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (&local_e8,local_460);
                *pvVar11 = *pvVar11 + 1;
              }
              rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920,
                                  (size_type)in_stack_fffffffffffff918);
              local_4c8 = rVar14;
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_4c8);
              in_stack_fffffffffffff95f = false;
              if (bVar1) {
                pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (&local_e8,local_460);
                in_stack_fffffffffffff95f = local_68 <= *pvVar11;
              }
              if ((bool)in_stack_fffffffffffff95f != false) {
                rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff920
                                    ,(size_type)in_stack_fffffffffffff918);
                local_4d8 = rVar15;
                std::_Bit_reference::operator=(&local_4d8,false);
                local_60 = local_60 - 1;
                local_3c4 = local_3c4 + 1;
              }
            }
          }
        }
        in_stack_fffffffffffff944 = Perseus::GetVerbose((Perseus *)(in_RSI + 0x10));
        if (-1 < in_stack_fffffffffffff944) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Added vector for ");
          in_stack_fffffffffffff930 =
               (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                *)std::ostream::operator<<(poVar4,local_88);
          in_stack_fffffffffffff928 =
               (multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                *)std::operator<<((ostream *)in_stack_fffffffffffff930," (");
          in_stack_fffffffffffff920 =
               (AlphaVector *)std::operator<<((ostream *)in_stack_fffffffffffff928," improved ");
          in_stack_fffffffffffff918 =
               (ostream *)std::ostream::operator<<(in_stack_fffffffffffff920,local_3c4);
          in_stack_fffffffffffff910 =
               (AlphaVector *)std::operator<<(in_stack_fffffffffffff918," nrNotImproved: ");
          in_stack_fffffffffffff908 =
               (AlphaVector *)std::ostream::operator<<(in_stack_fffffffffffff910,local_60);
          in_stack_fffffffffffff900 =
               (PlanningUnitMADPDiscrete *)std::operator<<((ostream *)in_stack_fffffffffffff908,")")
          ;
          std::ostream::operator<<(in_stack_fffffffffffff900,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::multi_array(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      Perseus::BackupStageLeadOut
                ((Perseus *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 in_stack_fffffffffffff9b8);
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::~multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                      *)in_stack_fffffffffffff900);
      local_ee = 1;
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)in_stack_fffffffffffff900);
      boost::
      multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
      ::~multi_array((multi_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                      *)in_stack_fffffffffffff900);
      AlphaVector::~AlphaVector((AlphaVector *)0x928449);
      std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector
                ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)in_stack_fffffffffffff910);
      if ((local_ee & 1) == 0) {
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffff910);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff910);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)in_stack_fffffffffffff910);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x9284fa);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff910);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffff910);
      return in_RDI;
    }
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[](in_RDI,(ulong)local_14c);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::clear
              ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x9277b4);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[](local_20,(ulong)local_14c);
    bVar1 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::empty
                      ((vector<AlphaVector,_std::allocator<AlphaVector>_> *)
                       in_stack_fffffffffffff910);
    if (bVar1) break;
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator[](local_20,(ulong)local_14c);
    BeliefValue::GetValues
              ((BeliefSet *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
               in_stack_fffffffffffff980);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffff900,(value_type *)in_stack_fffffffffffff8f8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff910);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::push_back((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)in_stack_fffffffffffff910,(value_type *)in_stack_fffffffffffff908);
    local_14c = local_14c + 1;
  }
  std::__cxx11::stringstream::stringstream(local_2d8);
  poVar4 = std::operator<<(local_2c8,"Empty Q-function for action ");
  std::ostream::operator<<(poVar4,local_14c);
  local_2f9 = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E((E *)in_stack_fffffffffffff900,(string *)in_stack_fffffffffffff8f8);
  local_2f9 = 0;
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

QFunctionsDiscrete
PerseusConstrainedPOMDPPlanner::BackupStage(const BeliefSet &S,
                                            const QFunctionsDiscrete &Q) const
{
    vector<vector<double> > VB;
    vector<double>  VBalpha; 
    
    size_t nrB=S.size(),
           nrNotImproved=nrB,
           nrA=GetPU()->GetNrJointActions(),
           nrS=GetPU()->GetNrStates(),
           k;
    vector<bool> stillNeedToBeImproved(nrB,true);
    vector<vector<bool> > logicTable;
    vector<unsigned int> numberOfImprovements(nrB,0);

    QFunctionsDiscrete Q1(Q.size());
    ValueFunctionPOMDPDiscrete V1;
    AlphaVector alpha(nrS);

#if PRUNE_QFUNCTIONS

    for(Index a = 0; a < nrA; ++a)
    {
      Q1[a] = AlphaVectorPlanning::Prune(Q[a]);
    }

    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q1);
#else
    V1 = AlphaVectorPlanning::QFunctionsToValueFunction(Q);
#endif

    for(Index a = 0; a < nrA; ++a)
    {
        Q1[a].clear();
        if(Q[a].empty())
        {
            stringstream estream;
            estream << "Empty Q-function for action " << a;
            throw E(estream.str());
        }
        VB.push_back(BeliefValue::GetValues(S,Q[a]));
        logicTable.push_back(stillNeedToBeImproved);
    }

    GaoVectorSet Gao=BackupStageLeadIn(V1);

    VectorSet Gab;

    while(nrNotImproved > 0)
    {
        int nrImprovedByGab=0;

        // sample a belief index from the number of not improved beliefs
        k=SampleNotImprovedBeliefIndex(stillNeedToBeImproved,nrNotImproved);

        Gab = BeliefBackupQ(*S[k],Gao,V1);
        for(size_t a = 0; a < nrA; a++)
        {
            alpha.SetAction(a);
            for(size_t s=0;s < nrS;s++)
              alpha.SetValue(Gab(a,s),s);

            // check whether the alphas improve the value of S[k]
            double x=S[k]->InnerProduct(alpha.GetValues());
            // if not, get copy from old value function
            if(x<VB[a][k])
            {
                alpha=BeliefValue::GetMaximizingVector(S,k,Q[a]);
#if DEBUG_PerseusConstrainedPOMDPPlanner
                cout << "Getting n-1 vector for " << k << endl;
#endif
            }
            
            // add alphas to Q1
            if(!VectorIsInValueFunction(alpha,Q1[a]))
                Q1[a].push_back(alpha);

            for(size_t b=0;b < nrB;b++)
            {
                if(!stillNeedToBeImproved[b])
                    continue;

                alpha=BeliefValue::GetMaximizingVector(S,b,Q1[a]);
                x=S[b]->InnerProduct(alpha.GetValues());

                if(logicTable[a][b] && x >= VB[a][b] - Globals::REWARD_PRECISION)
                {
                    logicTable[a][b] = false;
                    numberOfImprovements[b]++;
                }
                
                if(stillNeedToBeImproved[b] && numberOfImprovements[b] >= nrA)
                {
                    stillNeedToBeImproved[b]=false;
                    nrNotImproved--;
                    nrImprovedByGab++;
                }
            }
        }
        // update which beliefs have been improved

        if(GetVerbose() >= 0)
          cout << "Added vector for " << k << " ("
               << " improved " << nrImprovedByGab << " nrNotImproved: " << nrNotImproved << ")" << endl;
    }

    BackupStageLeadOut(Gao);

    return(Q1);
}